

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.cpp
# Opt level: O0

HighsPresolveStatus __thiscall PresolveComponent::run(PresolveComponent *this)

{
  bool bVar1;
  long in_RDI;
  HPresolve presolve;
  HighsPresolveLog *in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff900;
  HighsPresolveStatus in_stack_fffffffffffff904;
  HighsPostsolveStack *in_stack_fffffffffffffa20;
  HPresolve *in_stack_fffffffffffffa28;
  HighsTimer *in_stack_fffffffffffffac8;
  HighsInt in_stack_fffffffffffffad4;
  HighsOptions *in_stack_fffffffffffffad8;
  HighsLp *in_stack_fffffffffffffae0;
  HPresolve *in_stack_fffffffffffffae8;
  HighsPresolveStatus local_4;
  
  ::presolve::HPresolve::HPresolve
            ((HPresolve *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  bVar1 = ::presolve::HPresolve::okSetInput
                    (in_stack_fffffffffffffae8,in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                     in_stack_fffffffffffffad4,in_stack_fffffffffffffac8);
  if (bVar1) {
    ::presolve::HPresolve::run(in_stack_fffffffffffffa28,in_stack_fffffffffffffa20);
    ::presolve::HPresolve::getPresolveLog((HPresolve *)&stack0xfffffffffffff938);
    HighsPresolveLog::operator=
              ((HighsPresolveLog *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
               in_stack_fffffffffffff8f8);
    in_stack_fffffffffffff904 =
         ::presolve::HPresolve::getPresolveStatus((HPresolve *)&stack0xfffffffffffff938);
    *(HighsPresolveStatus *)(in_RDI + 0x5b0) = in_stack_fffffffffffff904;
    local_4 = *(HighsPresolveStatus *)(in_RDI + 0x5b0);
  }
  else {
    *(undefined4 *)(in_RDI + 0x5b0) = 9;
    local_4 = *(HighsPresolveStatus *)(in_RDI + 0x5b0);
  }
  ::presolve::HPresolve::~HPresolve
            ((HPresolve *)CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900));
  return local_4;
}

Assistant:

HighsPresolveStatus PresolveComponent::run() {
  presolve::HPresolve presolve;
  if (!presolve.okSetInput(data_.reduced_lp_, *options_,
                           options_->presolve_reduction_limit, timer)) {
    presolve_status_ = HighsPresolveStatus::kOutOfMemory;
    return presolve_status_;
  }

  presolve.run(data_.postSolveStack);
  data_.presolve_log_ = presolve.getPresolveLog();
  presolve_status_ = presolve.getPresolveStatus();
  return presolve_status_;
}